

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord1.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord1::Decode
          (RectangularVolumeRecord1 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x37 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>(stream,&(this->super_EnvironmentRecord).m_ui16Length);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Index);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Padding);
    (*(this->m_CornerLocation).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_CornerLocation,stream);
    (*(this->m_RecLength).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_RecLength,stream);
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void RectangularVolumeRecord1::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RECTANGLE_VOLUME_RECORD_1_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_CornerLocation
           >> KDIS_STREAM m_RecLength
           >> KDIS_STREAM m_Ori;
}